

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

QString * actionTypeToUString(QString *__return_storage_ptr__,UINT8 action)

{
  undefined7 in_register_00000031;
  char *ch;
  
  switch((int)CONCAT71(in_register_00000031,action)) {
  case 0x32:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",action);
    return __return_storage_ptr__;
  case 0x34:
    ch = "Create";
    break;
  case 0x35:
    ch = "Insert";
    break;
  case 0x36:
    ch = "Replace";
    break;
  case 0x37:
    ch = "Remove";
    break;
  case 0x38:
    ch = "Rebuild";
    break;
  case 0x39:
    ch = "Rebase";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

UString actionTypeToUString(const UINT8 action)
{
    switch (action) {
        case Actions::NoAction:      return UString();
        case Actions::Create:        return UString("Create");
        case Actions::Insert:        return UString("Insert");
        case Actions::Replace:       return UString("Replace");
        case Actions::Remove:        return UString("Remove");
        case Actions::Rebuild:       return UString("Rebuild");
        case Actions::Rebase:        return UString("Rebase");
    }
    
    return usprintf("Unknown %02Xh", action);
}